

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15bad7::EqualizerState::update
          (EqualizerState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  BiquadFilterR<float> *this_00;
  BiquadFilterR<float> *this_01;
  BiquadFilterR<float> *this_02;
  pointer paVar1;
  ulong uVar2;
  anon_struct_240_3_8d696fa7 *paVar3;
  MixParams *pMVar4;
  long lVar5;
  long lVar6;
  BiquadFilterR<float> *this_03;
  float fVar7;
  EffectSlot *local_88;
  MixParams *local_80;
  RealMixParams *local_78;
  undefined1 local_70 [12];
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 uStack_4c;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  pMVar4 = target.Main;
  fVar7 = (float)((context->mDevice).mPtr)->Frequency;
  paVar3 = this->mChans;
  BiquadFilterR<float>::setParamsFromSlope
            (paVar3->filter,LowShelf,(props->Reverb).Density / fVar7,SQRT((props->Reverb).Diffusion)
             ,0.75);
  this_00 = this->mChans[0].filter + 1;
  BiquadFilterR<float>::setParamsFromBandwidth
            (this_00,Peaking,(props->Reverb).Gain / fVar7,SQRT((props->Reverb).GainHF),
             (props->Reverb).DecayTime);
  this_01 = this->mChans[0].filter + 2;
  BiquadFilterR<float>::setParamsFromBandwidth
            (this_01,Peaking,(props->Reverb).DecayHFRatio / fVar7,
             SQRT((props->Reverb).ReflectionsGain),(props->Reverb).ReflectionsDelay);
  this_02 = this->mChans[0].filter + 3;
  BiquadFilterR<float>::setParamsFromSlope
            (this_02,HighShelf,(props->Reverb).LateReverbGain / fVar7,
             SQRT((props->Reverb).LateReverbDelay),0.75);
  this_03 = this->mChans[1].filter + 3;
  for (uVar2 = 1;
      uVar2 < (ulong)((long)(slot->Wet).Buffer.mDataEnd - (long)(slot->Wet).Buffer.mData >> 0xc);
      uVar2 = uVar2 + 1) {
    BiquadFilterR<float>::copyParamsFrom(this_03 + -3,paVar3->filter);
    BiquadFilterR<float>::copyParamsFrom(this_03 + -2,this_00);
    BiquadFilterR<float>::copyParamsFrom(this_03 + -1,this_01);
    BiquadFilterR<float>::copyParamsFrom(this_03,this_02);
    this_03 = (BiquadFilterR<float> *)&this_03[8].mB2;
  }
  paVar1 = (pMVar4->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (pMVar4->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  lVar5 = (long)(slot->Wet).Buffer.mDataEnd - (long)(slot->Wet).Buffer.mData;
  if (lVar5 != 0) {
    uStack_3c = 0;
    uStack_38 = 0;
    uStack_4c = 0;
    uStack_44 = 0;
    local_40 = 0;
    local_5c = 0;
    uStack_54 = 0;
    local_70._4_8_ = 0;
    uStack_64 = 0;
    local_70._0_4_ = 0x3f800000;
    local_88 = slot;
    local_80 = pMVar4;
    local_78 = target.RealOut;
    (anonymous_namespace)::EqualizerState::
    update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::$_0::operator()
              (&local_88,paVar3,(span<const_float,_16UL>)local_70);
    paVar3 = this->mChans;
    for (lVar6 = 0; paVar3 = paVar3 + 1, (lVar5 >> 0xc) + -1 != lVar6; lVar6 = lVar6 + 1) {
      *(undefined8 *)(local_70 + lVar6 * 4) = 0x3f80000000000000;
      (anonymous_namespace)::EqualizerState::
      update(ALCcontext_const*,EffectSlot_const*,EffectProps_const*,EffectTarget)::$_0::operator()
                (&local_88,paVar3,(span<const_float,_16UL>)local_70);
    }
  }
  return;
}

Assistant:

void EqualizerState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    auto frequency = static_cast<float>(device->Frequency);
    float gain, f0norm;

    /* Calculate coefficients for the each type of filter. Note that the shelf
     * and peaking filters' gain is for the centerpoint of the transition band,
     * while the effect property gains are for the shelf/peak itself. So the
     * property gains need their dB halved (sqrt of linear gain) for the
     * shelf/peak to reach the provided gain.
     */
    gain = std::sqrt(props->Equalizer.LowGain);
    f0norm = props->Equalizer.LowCutoff / frequency;
    mChans[0].filter[0].setParamsFromSlope(BiquadType::LowShelf, f0norm, gain, 0.75f);

    gain = std::sqrt(props->Equalizer.Mid1Gain);
    f0norm = props->Equalizer.Mid1Center / frequency;
    mChans[0].filter[1].setParamsFromBandwidth(BiquadType::Peaking, f0norm, gain,
        props->Equalizer.Mid1Width);

    gain = std::sqrt(props->Equalizer.Mid2Gain);
    f0norm = props->Equalizer.Mid2Center / frequency;
    mChans[0].filter[2].setParamsFromBandwidth(BiquadType::Peaking, f0norm, gain,
        props->Equalizer.Mid2Width);

    gain = std::sqrt(props->Equalizer.HighGain);
    f0norm = props->Equalizer.HighCutoff / frequency;
    mChans[0].filter[3].setParamsFromSlope(BiquadType::HighShelf, f0norm, gain, 0.75f);

    /* Copy the filter coefficients for the other input channels. */
    for(size_t i{1u};i < slot->Wet.Buffer.size();++i)
    {
        mChans[i].filter[0].copyParamsFrom(mChans[0].filter[0]);
        mChans[i].filter[1].copyParamsFrom(mChans[0].filter[1]);
        mChans[i].filter[2].copyParamsFrom(mChans[0].filter[2]);
        mChans[i].filter[3].copyParamsFrom(mChans[0].filter[3]);
    }

    mOutTarget = target.Main->Buffer;
    auto set_gains = [slot,target](auto &chan, al::span<const float,MAX_AMBI_CHANNELS> coeffs)
    { ComputePanGains(target.Main, coeffs.data(), slot->Gain, chan.TargetGains); };
    SetAmbiPanIdentity(std::begin(mChans), slot->Wet.Buffer.size(), set_gains);
}